

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

string * expect_eval_exception_abi_cxx11_(string *__return_storage_ptr__,wstring_view *text)

{
  undefined8 s;
  wostream *pwVar1;
  interpreter i;
  gc_heap h;
  undefined1 local_f1;
  interpreter local_f0;
  _Any_data local_e8;
  code *local_d8;
  undefined8 uStack_d0;
  undefined1 local_c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8 [13];
  value local_50;
  
  local_f0.impl_._M_t.
  super___uniq_ptr_impl<mjs::interpreter::impl,_std::default_delete<mjs::interpreter::impl>_>._M_t.
  super__Tuple_impl<0UL,_mjs::interpreter::impl_*,_std::default_delete<mjs::interpreter::impl>_>.
  super__Head_base<0UL,_mjs::interpreter::impl_*,_false>._M_head_impl._0_4_ = tested_version_;
  local_c0 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mjs::source_file,std::allocator<mjs::source_file>,wchar_t_const(&)[5],std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&,mjs::version>
            (local_b8,(source_file **)local_c0,(allocator<mjs::source_file> *)&local_f1,
             (wchar_t (*) [5])L"test",text,(version *)&local_f0);
  mjs::parse((mjs *)local_e8._M_pod_data,(shared_ptr<mjs::source_file> *)local_c0,non_strict);
  s = local_e8._M_unused._0_8_;
  local_e8._M_unused._M_object = (void *)0x0;
  if (local_b8[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8[0]._M_pi);
  }
  mjs::gc_heap::gc_heap((gc_heap *)local_c0,0x100000);
  local_d8 = (code *)0x0;
  uStack_d0 = 0;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  mjs::interpreter::interpreter
            (&local_f0,(gc_heap *)local_c0,tested_version_,(on_statement_executed_type *)&local_e8);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  mjs::interpreter::eval(&local_50,&local_f0,(statement *)s);
  mjs::value::destroy(&local_50);
  mjs::interpreter::~interpreter(&local_f0);
  mjs::gc_heap::~gc_heap((gc_heap *)local_c0);
  pwVar1 = std::operator<<((wostream *)&std::wcout,"Exception not thrown in\n");
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (pwVar1,text->_M_str,text->_M_len);
  std::operator<<(pwVar1,"\n");
  local_c0 = (undefined1  [8])0x1d;
  local_b8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x197d1e;
  mjs::throw_runtime_error
            ((string_view *)local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test.cpp",0x77);
}

Assistant:

std::string expect_eval_exception(const std::wstring_view& text) {
    decltype(parse(nullptr)) bs;
    try {
        bs = parse(std::make_shared<source_file>(L"test", text, tested_version()));
    } catch (const std::exception& e) {
        std::wcout << "Parse failed for \"" << text << "\": " << e.what() <<  "\n";
        throw;
    }

    try {
        gc_heap h{1<<20}; // Use local heap, even if expected lives in another heap
        interpreter i{h, tested_version()};
        (void) i.eval(*bs);
    } catch (const eval_exception& e) {
        return e.what();
    } catch (const std::exception& e) {
        std::wcout << "Unexpected exception thrown: " << e.what() << " while processing\n" << text << "\n"; 
        throw;
    }

    std::wcout << "Exception not thrown in\n" << text << "\n";
    THROW_RUNTIME_ERROR("Expected exception not thrown");
}